

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::SubroutinesBase::VerifyVS(SubroutinesBase *this,GLuint program,long *error)

{
  uint uVar1;
  mapped_type *pmVar2;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar3;
  bool local_14e9;
  _Self local_1350;
  key_type local_1344;
  _Self local_1340;
  int local_1338;
  allocator<char> local_1331;
  int i;
  _Base_ptr local_1310;
  undefined1 local_1308;
  allocator<char> local_12f9;
  key_type local_12f8;
  _Base_ptr local_12d8;
  undefined1 local_12d0;
  allocator<char> local_12c1;
  key_type local_12c0;
  undefined1 local_12a0 [8];
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> exp;
  key_type local_1268;
  GLsizei length;
  GLint param [1000];
  GLenum local_2c0;
  GLsizei bufSize;
  GLenum prop;
  undefined4 local_298;
  undefined4 local_294;
  GLint expectedU [4];
  GLenum propsU [4];
  key_type local_270;
  allocator<char> local_249;
  key_type local_248;
  undefined4 local_224;
  undefined4 local_220;
  GLint expectedS [1];
  GLenum propsS [1];
  allocator<char> local_1f1;
  string local_1f0 [39];
  allocator<char> local_1c9;
  key_type local_1c8;
  allocator<char> local_1a1;
  string local_1a0 [39];
  allocator<char> local_179;
  key_type local_178;
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  key_type local_128;
  allocator<char> local_101;
  string local_100 [32];
  undefined1 local_e0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesU;
  string local_a8 [55];
  allocator<char> local_71;
  string local_70 [32];
  undefined1 local_50 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesS;
  long *error_local;
  GLuint program_local;
  SubroutinesBase *this_local;
  
  indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)error;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92e8,0x92f6,2,indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92ee,0x92f5,1,indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92ee,0x92f6,2,indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd]
  )(this,(ulong)program,0x92ee,0x92f8,2,indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_70,"x",&local_71);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e8,local_50,local_70,
    indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"y",
             (allocator<char> *)
             ((long)&indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92e8,local_50,local_a8,
    indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"a",&local_101);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf]
  )(this,(ulong)program,0x92ee,local_e0,local_100,
    indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"x",&local_129);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_50,&local_128);
  uVar1 = *pmVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"x",&local_151);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e8,(ulong)uVar1,local_150,
            indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"y",&local_179);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_50,&local_178);
  uVar1 = *pmVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"y",&local_1a1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92e8,(ulong)uVar1,local_1a0,
            indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"a",&local_1c9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_e0,&local_1c8);
  uVar1 = *pmVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"a",&local_1f1);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x10])(this,(ulong)program,0x92ee,(ulong)uVar1,local_1f0,
            indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)propsS,"a",(allocator<char> *)((long)expectedS + 3));
  uVar1 = glu::CallLogWrapper::glGetSubroutineUniformLocation
                    (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,program,0x8b31,"a");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92ee,propsS,(ulong)uVar1,
            indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)propsS);
  std::allocator<char>::~allocator((allocator<char> *)((long)expectedS + 3));
  local_220 = 0x92f9;
  local_224 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"x",&local_249);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_50,&local_248);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e8,(ulong)*pmVar2,1,&local_220,1,&local_224,
            indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270,"y",(allocator<char> *)((long)propsU + 0xf));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_50,&local_270);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e8,(ulong)*pmVar2,1,&local_220,1,&local_224,
            indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)((long)propsU + 0xf));
  expectedU[2] = 0x92f9;
  expectedU[3] = 0x92fb;
  propsU[0] = 0x8e4a;
  propsU[1] = 0x930e;
  local_298 = 2;
  local_294 = 1;
  expectedU[0] = 2;
  expectedU[1] = glu::CallLogWrapper::glGetSubroutineUniformLocation
                           (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.
                             super_GLWrapper.super_CallLogWrapper,program,0x8b31,"a");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&prop,"a",(allocator<char> *)((long)&bufSize + 3));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_e0,(key_type *)&prop);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92ee,(ulong)*pmVar2,4,expectedU + 2,4,&local_298,
            indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&prop);
  std::allocator<char>::~allocator((allocator<char> *)((long)&bufSize + 3));
  local_2c0 = 0x8e4b;
  param[999] = 1000;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_12a0
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12c0,"x",&local_12c1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_50,&local_12c0);
  pVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_12a0,pmVar2);
  local_12d8 = (_Base_ptr)pVar3.first._M_node;
  local_12d0 = pVar3.second;
  std::__cxx11::string::~string((string *)&local_12c0);
  std::allocator<char>::~allocator(&local_12c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_12f8,"y",&local_12f9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_50,&local_12f8);
  pVar3 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     local_12a0,pmVar2);
  local_1310 = (_Base_ptr)pVar3.first._M_node;
  local_1308 = pVar3.second;
  std::__cxx11::string::~string((string *)&local_12f8);
  std::allocator<char>::~allocator(&local_12f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"a",&local_1331);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_e0,(key_type *)&i);
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,program,0x92ee,*pmVar2,1,&local_2c0,1000,
             (GLsizei *)((long)&exp._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),
             (GLint *)&local_1268);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator(&local_1331);
  for (local_1338 = 0; local_1338 < (int)exp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
      local_1338 = local_1338 + 1) {
    local_1344 = (&local_1268)[local_1338];
    local_1340._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::find
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    local_12a0,&local_1344);
    local_1350._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                    local_12a0);
    local_14e9 = std::operator==(&local_1340,&local_1350);
    local_14e9 = local_14e9 || exp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ != 2;
    if (local_14e9) {
      anon_unknown_0::Output
                ("Length: %d\n",(ulong)exp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
      anon_unknown_0::Output
                ("Unexpected index/length found in active variables of GL_VERTEX_SUBROUTINE_UNIFORM: %d\n"
                 ,(ulong)(&local_1268)[local_1338]);
      *(undefined8 *)indicesS._M_t._M_impl.super__Rb_tree_header._M_node_count = 0xffffffffffffffff;
    }
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_12a0
            );
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_e0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_50);
  return;
}

Assistant:

virtual void inline VerifyVS(GLuint program, long& error)
	{
		VerifyGetProgramInterfaceiv(program, GL_VERTEX_SUBROUTINE, GL_ACTIVE_RESOURCES, 2, error);
		VerifyGetProgramInterfaceiv(program, GL_VERTEX_SUBROUTINE, GL_MAX_NAME_LENGTH, 2, error);

		VerifyGetProgramInterfaceiv(program, GL_VERTEX_SUBROUTINE_UNIFORM, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(program, GL_VERTEX_SUBROUTINE_UNIFORM, GL_MAX_NAME_LENGTH, 2, error);
		VerifyGetProgramInterfaceiv(program, GL_VERTEX_SUBROUTINE_UNIFORM, GL_MAX_NUM_COMPATIBLE_SUBROUTINES, 2, error);

		std::map<std::string, GLuint> indicesS;
		VerifyGetProgramResourceIndex(program, GL_VERTEX_SUBROUTINE, indicesS, "x", error);
		VerifyGetProgramResourceIndex(program, GL_VERTEX_SUBROUTINE, indicesS, "y", error);
		std::map<std::string, GLuint> indicesU;
		VerifyGetProgramResourceIndex(program, GL_VERTEX_SUBROUTINE_UNIFORM, indicesU, "a", error);

		VerifyGetProgramResourceName(program, GL_VERTEX_SUBROUTINE, indicesS["x"], "x", error);
		VerifyGetProgramResourceName(program, GL_VERTEX_SUBROUTINE, indicesS["y"], "y", error);
		VerifyGetProgramResourceName(program, GL_VERTEX_SUBROUTINE_UNIFORM, indicesU["a"], "a", error);

		VerifyGetProgramResourceLocation(program, GL_VERTEX_SUBROUTINE_UNIFORM, "a",
										 glGetSubroutineUniformLocation(program, GL_VERTEX_SHADER, "a"), error);

		GLenum propsS[]	= { GL_NAME_LENGTH };
		GLint  expectedS[] = { 2 };
		VerifyGetProgramResourceiv(program, GL_VERTEX_SUBROUTINE, indicesS["x"], 1, propsS, 1, expectedS, error);
		VerifyGetProgramResourceiv(program, GL_VERTEX_SUBROUTINE, indicesS["y"], 1, propsS, 1, expectedS, error);

		GLenum propsU[]	= { GL_NAME_LENGTH, GL_ARRAY_SIZE, GL_NUM_COMPATIBLE_SUBROUTINES, GL_LOCATION };
		GLint  expectedU[] = { 2, 1, 2, glGetSubroutineUniformLocation(program, GL_VERTEX_SHADER, "a") };
		VerifyGetProgramResourceiv(program, GL_VERTEX_SUBROUTINE_UNIFORM, indicesU["a"], 4, propsU, 4, expectedU,
								   error);

		GLenum			 prop	= GL_COMPATIBLE_SUBROUTINES;
		const GLsizei	bufSize = 1000;
		GLint			 param[bufSize];
		GLsizei			 length;
		std::set<GLuint> exp;
		exp.insert(indicesS["x"]);
		exp.insert(indicesS["y"]);
		glGetProgramResourceiv(program, GL_VERTEX_SUBROUTINE_UNIFORM, indicesU["a"], 1, &prop, bufSize, &length, param);
		for (int i = 0; i < length; ++i)
		{
			if (exp.find(param[i]) == exp.end() || length != 2)
			{
				Output("Length: %d\n", length);
				Output("Unexpected index/length found in active variables of GL_VERTEX_SUBROUTINE_UNIFORM: %d\n",
					   param[i]);
				error = ERROR;
			}
		}
	}